

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O0

string * __thiscall KMeans::genModelEvaluationFunction_abi_cxx11_(KMeans *this)

{
  bool bVar1;
  reference ppAVar2;
  long in_RSI;
  string *in_RDI;
  string evalFunction;
  string *attName;
  string *origView;
  size_t origVar;
  size_t var_2;
  string precompMeanSum;
  string numCategVar;
  string *viewName;
  string *varName;
  Attribute *att_1;
  size_t var_1;
  string valueToMeanMap;
  string distance;
  size_t categVarIdx;
  string loadFunction;
  string testTuple;
  Attribute *att;
  size_t var;
  string attrConstruct;
  string attributeString;
  Attribute *in_stack_ffffffffffffe078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe088;
  undefined6 in_stack_ffffffffffffe090;
  undefined1 in_stack_ffffffffffffe096;
  undefined1 in_stack_ffffffffffffe097;
  byte bVar3;
  byte bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe0a0;
  undefined7 in_stack_ffffffffffffe0a8;
  byte in_stack_ffffffffffffe0af;
  Attribute *in_stack_ffffffffffffe0b0;
  undefined7 in_stack_ffffffffffffe0b8;
  byte in_stack_ffffffffffffe0bf;
  undefined8 in_stack_ffffffffffffe0c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Application *in_stack_ffffffffffffe0c8;
  Application *this_00;
  string local_1f00 [32];
  string local_1ee0 [32];
  string local_1ec0 [32];
  string local_1ea0 [32];
  string local_1e80 [32];
  string local_1e60 [32];
  string local_1e40 [32];
  string local_1e20 [32];
  string local_1e00 [32];
  string local_1de0 [32];
  string local_1dc0 [32];
  string local_1da0 [32];
  string local_1d80 [32];
  string local_1d60 [32];
  string local_1d40 [32];
  string local_1d20 [32];
  string local_1d00 [32];
  string local_1ce0 [32];
  string local_1cc0 [32];
  string local_1ca0 [32];
  string local_1c80 [32];
  string local_1c60 [32];
  string local_1c40 [32];
  string local_1c20 [32];
  string local_1c00 [32];
  string local_1be0 [32];
  string local_1bc0 [32];
  string local_1ba0 [32];
  string local_1b80 [32];
  string local_1b60 [32];
  string local_1b40 [32];
  string local_1b20 [32];
  string local_1b00 [32];
  string local_1ae0 [32];
  string local_1ac0 [32];
  string local_1aa0 [32];
  string local_1a80 [32];
  string local_1a60 [32];
  string local_1a40 [32];
  string local_1a20 [32];
  string local_1a00 [32];
  string local_19e0 [32];
  string local_19c0 [32];
  string local_19a0 [32];
  string local_1980 [32];
  string local_1960 [32];
  string local_1940 [32];
  string local_1920 [32];
  string local_1900 [32];
  string local_18e0 [32];
  string local_18c0 [32];
  string local_18a0 [32];
  string local_1880 [32];
  string local_1860 [32];
  string local_1840 [32];
  string local_1820 [32];
  string local_1800 [32];
  string local_17e0 [32];
  string local_17c0 [32];
  string local_17a0 [32];
  string local_1780 [32];
  string local_1760 [32];
  string local_1740 [32];
  string local_1720 [32];
  string local_1700 [32];
  string local_16e0 [32];
  string local_16c0 [32];
  string local_16a0 [32];
  string local_1680 [32];
  string local_1660 [32];
  string local_1640 [32];
  string local_1620 [32];
  string local_1600 [32];
  string local_15e0 [32];
  string local_15c0 [32];
  string local_15a0 [32];
  string local_1580 [32];
  string local_1560 [32];
  string local_1540 [32];
  string local_1520 [32];
  string local_1500 [32];
  string local_14e0 [32];
  string local_14c0 [32];
  string local_14a0 [32];
  string local_1480 [32];
  string local_1460 [32];
  string local_1440 [32];
  string local_1420 [32];
  string local_1400 [32];
  string local_13e0 [32];
  string local_13c0 [32];
  string local_13a0 [32];
  string local_1380 [32];
  string local_1360 [32];
  string local_1340 [32];
  string local_1320 [32];
  string local_1300 [32];
  string local_12e0 [32];
  string local_12c0 [32];
  string local_12a0 [32];
  string local_1280 [32];
  string local_1260 [32];
  string local_1240 [32];
  string local_1220 [32];
  string local_1200 [32];
  string local_11e0 [32];
  string local_11c0 [32];
  string local_11a0 [32];
  string local_1180 [32];
  string local_1160 [32];
  string local_1140 [32];
  string local_1120 [32];
  string local_1100 [32];
  string local_10e0 [32];
  string *local_10c0;
  string local_10b8 [32];
  string local_1098 [32];
  string *local_1078;
  mapped_type local_1070;
  byte local_1061;
  reference local_1060;
  reference local_1050;
  ulong local_1040;
  allocator local_1031;
  string local_1030 [32];
  string local_1010 [32];
  string local_ff0 [32];
  string local_fd0 [32];
  string local_fb0 [32];
  string local_f90 [32];
  string local_f70 [32];
  string local_f50 [32];
  string local_f30 [32];
  string local_f10 [32];
  string local_ef0 [32];
  string local_ed0 [32];
  string local_eb0 [32];
  string local_e90 [32];
  string local_e70 [32];
  string local_e50 [32];
  string local_e30 [32];
  string local_e10 [32];
  string local_df0 [32];
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90 [32];
  string local_d70 [32];
  string local_d50 [32];
  string local_d30 [32];
  string local_d10 [32];
  string local_cf0 [32];
  string local_cd0 [32];
  string local_cb0 [32];
  string local_c90 [32];
  string local_c70 [32];
  string local_c50 [32];
  string local_c30 [32];
  string local_c10 [32];
  string local_bf0 [32];
  string local_bd0 [32];
  string local_bb0 [32];
  string local_b90 [32];
  string local_b70 [32];
  string local_b50 [32];
  string local_b30 [32];
  string local_b10 [32];
  string *local_af0;
  reference local_ae8;
  string *local_ad8;
  Attribute *local_ad0;
  reference local_ac8;
  ulong local_ab8;
  undefined1 local_aa9 [40];
  undefined1 local_a81 [33];
  long local_a60;
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  Attribute *local_98;
  ulong local_90;
  string local_88 [32];
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::__cxx11::string::~string(local_88);
  for (local_90 = 0; local_90 < *(ulong *)(in_RSI + 0xb0); local_90 = local_90 + 1) {
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x27172c);
    local_98 = TreeDecomposition::getAttribute
                         ((TreeDecomposition *)
                          CONCAT17(in_stack_ffffffffffffe097,
                                   CONCAT16(in_stack_ffffffffffffe096,in_stack_ffffffffffffe090)),
                          (size_t)in_stack_ffffffffffffe088);
    Application::offset_abi_cxx11_
              ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
               (size_t)in_stack_ffffffffffffe0b0);
    std::operator+((char *)in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
    std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
    Application::typeToStr_abi_cxx11_
              (in_stack_ffffffffffffe0c8,(Type)((ulong)in_stack_ffffffffffffe0c0 >> 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe0b0);
    std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
    std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
    std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
    std::__cxx11::string::operator+=(local_68,local_b8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_178);
    Application::offset_abi_cxx11_
              ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
               (size_t)in_stack_ffffffffffffe0b0);
    Application::typeToStr_abi_cxx11_
              (in_stack_ffffffffffffe0c8,(Type)((ulong)in_stack_ffffffffffffe0c0 >> 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe0b0);
    std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
    std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
    std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
    std::__cxx11::string::operator+=(local_30,local_1b8);
    std::__cxx11::string::~string(local_1b8);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_258);
    std::__cxx11::string::~string(local_238);
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((char *)in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::__cxx11::string::operator+=(local_68,local_278);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_2b8);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_4f8);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::~string(local_4b8);
  std::__cxx11::string::~string(local_3f8);
  std::__cxx11::string::~string(local_418);
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string(local_498);
  std::__cxx11::string::~string(local_458);
  std::__cxx11::string::~string(local_478);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::__cxx11::string::~string(local_558);
  std::__cxx11::string::~string(local_a58);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_a38);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_a18);
  std::__cxx11::string::~string(local_5f8);
  std::__cxx11::string::~string(local_618);
  std::__cxx11::string::~string(local_9f8);
  std::__cxx11::string::~string(local_638);
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string(local_9d8);
  std::__cxx11::string::~string(local_678);
  std::__cxx11::string::~string(local_698);
  std::__cxx11::string::~string(local_9b8);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string(local_6d8);
  std::__cxx11::string::~string(local_998);
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::string::~string(local_718);
  std::__cxx11::string::~string(local_978);
  std::__cxx11::string::~string(local_738);
  std::__cxx11::string::~string(local_758);
  std::__cxx11::string::~string(local_958);
  std::__cxx11::string::~string(local_778);
  std::__cxx11::string::~string(local_798);
  std::__cxx11::string::~string(local_938);
  std::__cxx11::string::~string(local_7b8);
  std::__cxx11::string::~string(local_7d8);
  std::__cxx11::string::~string(local_918);
  std::__cxx11::string::~string(local_7f8);
  std::__cxx11::string::~string(local_818);
  std::__cxx11::string::~string(local_8f8);
  std::__cxx11::string::~string(local_838);
  std::__cxx11::string::~string(local_858);
  std::__cxx11::string::~string(local_8d8);
  std::__cxx11::string::~string(local_878);
  std::__cxx11::string::~string(local_898);
  std::__cxx11::string::~string(local_8b8);
  local_a60 = 0;
  this_00 = (Application *)local_a81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a81 + 1),"",(allocator *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_a81);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_aa9 + 1),"",(allocator *)__rhs);
  std::allocator<char>::~allocator((allocator<char> *)local_aa9);
  for (local_ab8 = 0; local_ab8 < 100; local_ab8 = local_ab8 + 1) {
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)in_stack_ffffffffffffe088,(size_t)in_stack_ffffffffffffe080);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffe080);
    in_stack_ffffffffffffe0bf = bVar1 ^ 0xff;
    std::bitset<100UL>::reference::~reference(&local_ac8);
    if ((in_stack_ffffffffffffe0bf & 1) == 0) {
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x273191);
      in_stack_ffffffffffffe0b0 =
           TreeDecomposition::getAttribute
                     ((TreeDecomposition *)
                      CONCAT17(in_stack_ffffffffffffe097,
                               CONCAT16(in_stack_ffffffffffffe096,in_stack_ffffffffffffe090)),
                      (size_t)in_stack_ffffffffffffe088);
      local_ad8 = &in_stack_ffffffffffffe0b0->_name;
      local_ad0 = in_stack_ffffffffffffe0b0;
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_ffffffffffffe088,(size_t)in_stack_ffffffffffffe080);
      in_stack_ffffffffffffe0af =
           std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffe080);
      std::bitset<100UL>::reference::~reference(&local_ae8);
      if ((in_stack_ffffffffffffe0af & 1) == 0) {
        std::operator+((char *)this_00,__rhs);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::__cxx11::string::operator+=((string *)(local_a81 + 1),local_ef0);
        std::__cxx11::string::~string(local_ef0);
        std::__cxx11::string::~string(local_f10);
        std::__cxx11::string::~string(local_f30);
        std::__cxx11::string::~string(local_f50);
        std::__cxx11::string::~string(local_f70);
        std::__cxx11::string::~string(local_f90);
        std::__cxx11::string::~string(local_fb0);
        std::__cxx11::string::~string(local_fd0);
        std::__cxx11::string::~string(local_ff0);
      }
      else {
        in_stack_ffffffffffffe0a0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        ppAVar2 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                            ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                             (*(long *)(in_RSI + 0x100 + local_ab8 * 8) + 0x18),0);
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::operator[](&(*ppAVar2)->_incoming,(size_type)in_stack_ffffffffffffe0a0);
        std::__cxx11::to_string(CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8));
        std::operator+((char *)in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::__cxx11::string::~string(local_b30);
        local_af0 = local_b10;
        std::operator+((char *)this_00,__rhs);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::__cxx11::string::operator+=((string *)(local_a81 + 1),local_b50);
        std::__cxx11::string::~string(local_b50);
        std::__cxx11::string::~string(local_b70);
        std::__cxx11::string::~string(local_b90);
        std::__cxx11::string::~string(local_bb0);
        std::__cxx11::string::~string(local_bd0);
        std::__cxx11::string::~string(local_bf0);
        Application::offset_abi_cxx11_
                  ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                   (size_t)in_stack_ffffffffffffe0b0);
        std::operator+((char *)in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        Application::typeToStr_abi_cxx11_(this_00,(Type)((ulong)__rhs >> 0x20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe0b0);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        Application::offset_abi_cxx11_
                  ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                   (size_t)in_stack_ffffffffffffe0b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe0b0);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        Application::offset_abi_cxx11_
                  ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                   (size_t)in_stack_ffffffffffffe0b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe0b0);
        std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
        std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
        std::__cxx11::string::operator+=((string *)(local_aa9 + 1),local_c10);
        std::__cxx11::string::~string(local_c10);
        std::__cxx11::string::~string(local_c30);
        std::__cxx11::string::~string(local_c50);
        std::__cxx11::string::~string(local_c70);
        std::__cxx11::string::~string(local_c90);
        std::__cxx11::string::~string(local_cb0);
        std::__cxx11::string::~string(local_cd0);
        std::__cxx11::string::~string(local_ed0);
        std::__cxx11::string::~string(local_cf0);
        std::__cxx11::string::~string(local_d10);
        std::__cxx11::string::~string(local_d30);
        std::__cxx11::string::~string(local_d50);
        std::__cxx11::string::~string(local_eb0);
        std::__cxx11::string::~string(local_d70);
        std::__cxx11::string::~string(local_d90);
        std::__cxx11::string::~string(local_db0);
        std::__cxx11::string::~string(local_dd0);
        std::__cxx11::string::~string(local_df0);
        std::__cxx11::string::~string(local_e10);
        std::__cxx11::string::~string(local_e90);
        std::__cxx11::string::~string(local_e30);
        std::__cxx11::string::~string(local_e50);
        std::__cxx11::string::~string(local_e70);
        local_a60 = local_a60 + 1;
        std::__cxx11::string::~string(local_b10);
      }
    }
  }
  std::bitset<100UL>::count((bitset<100UL> *)0x273f79);
  std::__cxx11::to_string(CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1030,"",&local_1031);
  std::allocator<char>::~allocator((allocator<char> *)&local_1031);
  for (local_1040 = 0; local_1040 < 100; local_1040 = local_1040 + 1) {
    local_1061 = 0;
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)in_stack_ffffffffffffe088,(size_t)in_stack_ffffffffffffe080);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffe080);
    bVar3 = 1;
    if (bVar1) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_ffffffffffffe088,(size_t)in_stack_ffffffffffffe080);
      local_1061 = 1;
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffe080);
      bVar3 = bVar1 ^ 0xff;
    }
    bVar4 = bVar3;
    if ((local_1061 & 1) != 0) {
      std::bitset<100UL>::reference::~reference(&local_1060);
    }
    std::bitset<100UL>::reference::~reference(&local_1050);
    if ((bVar3 & 1) == 0) {
      in_stack_ffffffffffffe088 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         *)in_stack_ffffffffffffe080,(key_type *)in_stack_ffffffffffffe078);
      local_1070 = *(mapped_type *)in_stack_ffffffffffffe088;
      in_stack_ffffffffffffe080 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      ppAVar2 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                           (*(long *)(in_RSI + 0x100 + local_1070 * 8) + 0x18),0);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::operator[](&(*ppAVar2)->_incoming,(size_type)in_stack_ffffffffffffe080);
      std::__cxx11::to_string(CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8));
      std::operator+((char *)in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
      std::__cxx11::string::~string(local_10b8);
      local_1078 = local_1098;
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2741c8);
      in_stack_ffffffffffffe078 =
           TreeDecomposition::getAttribute
                     ((TreeDecomposition *)CONCAT17(bVar4,CONCAT16(bVar3,in_stack_ffffffffffffe090))
                      ,(size_t)in_stack_ffffffffffffe088);
      local_10c0 = &in_stack_ffffffffffffe078->_name;
      Application::offset_abi_cxx11_
                ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (size_t)in_stack_ffffffffffffe0b0);
      std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
      std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
      std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
      Application::offset_abi_cxx11_
                ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (size_t)in_stack_ffffffffffffe0b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe0b0);
      std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
      std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
      std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
      std::__cxx11::string::operator+=(local_1030,local_10e0);
      std::__cxx11::string::~string(local_10e0);
      std::__cxx11::string::~string(local_1100);
      std::__cxx11::string::~string(local_1120);
      std::__cxx11::string::~string(local_1140);
      std::__cxx11::string::~string(local_11e0);
      std::__cxx11::string::~string(local_1160);
      std::__cxx11::string::~string(local_1180);
      std::__cxx11::string::~string(local_11a0);
      std::__cxx11::string::~string(local_11c0);
      std::__cxx11::string::~string(local_1098);
    }
  }
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  Application::offset_abi_cxx11_
            ((Application *)CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
             (size_t)in_stack_ffffffffffffe0b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0bf,in_stack_ffffffffffffe0b8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe0b0);
  std::operator+(in_stack_ffffffffffffe088,(char *)in_stack_ffffffffffffe080);
  std::__cxx11::string::~string(local_1220);
  std::__cxx11::string::~string(local_1ee0);
  std::__cxx11::string::~string(local_1240);
  std::__cxx11::string::~string(local_1260);
  std::__cxx11::string::~string(local_1ec0);
  std::__cxx11::string::~string(local_1280);
  std::__cxx11::string::~string(local_12a0);
  std::__cxx11::string::~string(local_1ea0);
  std::__cxx11::string::~string(local_12c0);
  std::__cxx11::string::~string(local_12e0);
  std::__cxx11::string::~string(local_1e80);
  std::__cxx11::string::~string(local_1300);
  std::__cxx11::string::~string(local_1320);
  std::__cxx11::string::~string(local_1e60);
  std::__cxx11::string::~string(local_1340);
  std::__cxx11::string::~string(local_1360);
  std::__cxx11::string::~string(local_1e40);
  std::__cxx11::string::~string(local_1380);
  std::__cxx11::string::~string(local_13a0);
  std::__cxx11::string::~string(local_1e20);
  std::__cxx11::string::~string(local_13c0);
  std::__cxx11::string::~string(local_13e0);
  std::__cxx11::string::~string(local_1e00);
  std::__cxx11::string::~string(local_1400);
  std::__cxx11::string::~string(local_1420);
  std::__cxx11::string::~string(local_1440);
  std::__cxx11::string::~string(local_1de0);
  std::__cxx11::string::~string(local_1460);
  std::__cxx11::string::~string(local_1480);
  std::__cxx11::string::~string(local_1dc0);
  std::__cxx11::string::~string(local_14a0);
  std::__cxx11::string::~string(local_14c0);
  std::__cxx11::string::~string(local_1da0);
  std::__cxx11::string::~string(local_14e0);
  std::__cxx11::string::~string(local_1500);
  std::__cxx11::string::~string(local_1d80);
  std::__cxx11::string::~string(local_1520);
  std::__cxx11::string::~string(local_1540);
  std::__cxx11::string::~string(local_1d60);
  std::__cxx11::string::~string(local_1560);
  std::__cxx11::string::~string(local_1580);
  std::__cxx11::string::~string(local_1d40);
  std::__cxx11::string::~string(local_15a0);
  std::__cxx11::string::~string(local_15c0);
  std::__cxx11::string::~string(local_15e0);
  std::__cxx11::string::~string(local_1600);
  std::__cxx11::string::~string(local_1620);
  std::__cxx11::string::~string(local_1640);
  std::__cxx11::string::~string(local_1d20);
  std::__cxx11::string::~string(local_1660);
  std::__cxx11::string::~string(local_1680);
  std::__cxx11::string::~string(local_1d00);
  std::__cxx11::string::~string(local_16a0);
  std::__cxx11::string::~string(local_16c0);
  std::__cxx11::string::~string(local_1ce0);
  std::__cxx11::string::~string(local_16e0);
  std::__cxx11::string::~string(local_1700);
  std::__cxx11::string::~string(local_1cc0);
  std::__cxx11::string::~string(local_1720);
  std::__cxx11::string::~string(local_1740);
  std::__cxx11::string::~string(local_1ca0);
  std::__cxx11::string::~string(local_1760);
  std::__cxx11::string::~string(local_1780);
  std::__cxx11::string::~string(local_1c80);
  std::__cxx11::string::~string(local_17a0);
  std::__cxx11::string::~string(local_17c0);
  std::__cxx11::string::~string(local_1c60);
  std::__cxx11::string::~string(local_17e0);
  std::__cxx11::string::~string(local_1800);
  std::__cxx11::string::~string(local_1820);
  std::__cxx11::string::~string(local_1c40);
  std::__cxx11::string::~string(local_1840);
  std::__cxx11::string::~string(local_1860);
  std::__cxx11::string::~string(local_1c20);
  std::__cxx11::string::~string(local_1880);
  std::__cxx11::string::~string(local_18a0);
  std::__cxx11::string::~string(local_18c0);
  std::__cxx11::string::~string(local_1c00);
  std::__cxx11::string::~string(local_18e0);
  std::__cxx11::string::~string(local_1900);
  std::__cxx11::string::~string(local_1be0);
  std::__cxx11::string::~string(local_1920);
  std::__cxx11::string::~string(local_1940);
  std::__cxx11::string::~string(local_1bc0);
  std::__cxx11::string::~string(local_1960);
  std::__cxx11::string::~string(local_1980);
  std::__cxx11::string::~string(local_1ba0);
  std::__cxx11::string::~string(local_19a0);
  std::__cxx11::string::~string(local_19c0);
  std::__cxx11::string::~string(local_19e0);
  std::__cxx11::string::~string(local_1a00);
  std::__cxx11::string::~string(local_1b80);
  std::__cxx11::string::~string(local_1a20);
  std::__cxx11::string::~string(local_1a40);
  std::__cxx11::string::~string(local_1b60);
  std::__cxx11::string::~string(local_1a60);
  std::__cxx11::string::~string(local_1a80);
  std::__cxx11::string::~string(local_1b40);
  std::__cxx11::string::~string(local_1aa0);
  std::__cxx11::string::~string(local_1ac0);
  std::__cxx11::string::~string(local_1b20);
  std::__cxx11::string::~string(local_1ae0);
  std::__cxx11::string::~string(local_1b00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe0af,in_stack_ffffffffffffe0a8),
                 in_stack_ffffffffffffe0a0);
  std::operator+(in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
  std::__cxx11::string::~string(local_1f00);
  std::__cxx11::string::~string(local_1200);
  std::__cxx11::string::~string(local_1030);
  std::__cxx11::string::~string(local_1010);
  std::__cxx11::string::~string((string *)(local_aa9 + 1));
  std::__cxx11::string::~string((string *)(local_a81 + 1));
  std::__cxx11::string::~string(local_538);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string KMeans::genModelEvaluationFunction()
{
    std::string attributeString = "",
        attrConstruct = offset(4)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
    
    for (size_t var = 0; var < numberOfOriginalVariables; ++var)
    {
        Attribute* att = _td->getAttribute(var);
        attrConstruct += "\n"+offset(5)+"qi::"+typeToStr(att->_type)+
            "_[phoenix::ref("+att->_name+") = qi::_1]>>";
        attributeString += offset(2)+typeToStr(att->_type) + " "+
            att->_name + ";\n";
    }

    // attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct += ",\n"+offset(5)+"\'|\');\n";

    std::string testTuple = offset(1)+"struct Test_tuple\n"+offset(1)+"{\n"+
        attributeString+offset(2)+"Test_tuple(const std::string& tuple)\n"+
        offset(2)+"{\n"+attrConstruct+offset(2)+"}\n"+offset(1)+"};\n\n";

    std::string loadFunction = offset(1)+"void loadTestDataset("+
        "std::vector<Test_tuple>& TestDataset)\n"+offset(1)+"{\n"+
        offset(2)+"std::ifstream input;\n"+offset(2)+"std::string line;\n"+
        offset(2)+"input.open(PATH_TO_DATA + \"/joinresult.tbl\");\n"+
        offset(2)+"if (!input)\n"+offset(2)+"{\n"+
        offset(3)+"std::cerr << \"joinresult.tbl does is not exist.\\n\";\n"+
        offset(3)+"exit(1);\n"+offset(2)+"}\n"+
        offset(2)+"while(getline(input, line))\n"+
        offset(3)+"TestDataset.push_back(Test_tuple(line));\n"+
        offset(2)+"input.close();\n"+offset(1)+"}\n\n";

    size_t categVarIdx = 0;
    std::string distance = "", valueToMeanMap = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;

        Attribute* att = _td->getAttribute(var);
        std::string& varName = att->_name;
        
        if (_isCategoricalFeature[var])
        {
            const std::string& viewName = "V"+std::to_string(
                varToQuery[var]->_aggregates[0]->_incoming[0].first);
            
            distance += "-2*means[cluster].cluster_"+varName+"["+
                varName+"_clusterIndex[tuple."+varName+"]]";

            valueToMeanMap += "\n"+offset(2)+"std::unordered_map<"+
                typeToStr(att->_type)+", size_t> "+
                varName+"_clusterIndex("+viewName+".size());\n"+
                offset(2)+"for (size_t l=0; l<"+viewName+".size(); ++l)\n"+
                offset(3)+varName+"_clusterIndex["+viewName+"[l]."+varName+"] = l;\n";

            ++categVarIdx;
        }
        else
            distance += "+((tuple."+att->_name+"-means[cluster].cluster_"+att->_name+")"+
                "*(tuple."+att->_name+"-means[cluster].cluster_"+att->_name+"))";
    }
    
    std::string numCategVar = std::to_string(_isCategoricalFeature.count()/2); 

    std::string precompMeanSum = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!clusterVariables[var] || !_isCategoricalFeature[var])
            continue;

        size_t origVar = clusterToVariableMap[var];
        const std::string& origView = "V"+std::to_string(
            varToQuery[origVar]->_aggregates[0]->_incoming[0].first);

        const std::string& attName = _td->getAttribute(var)->_name;

        // precompMeanSum += offset(2)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        //     Offset(2)+"{\N"+offset(3)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
        //     offset(4)+"sum_mean_squared[idx] += std::pow(means[cluster]."
        //     +attName+"[i],2);\n"+offset(3)+"++idx;\n"+offset(2)+"}\n\n";
        
        precompMeanSum += offset(3)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
            offset(4)+"sum_mean_squared[cluster] += std::pow(mean_tuple."
            +attName+"[i],2);\n\n";
    }
    
    std::string evalFunction = offset(1)+"void evaluateModel(Cluster_mean* means)\n"+
        offset(1)+"{\n"+
        offset(2)+"std::vector<Test_tuple> TestDataset;\n"+
        offset(2)+"loadTestDataset(TestDataset);\n"+
        offset(2)+"size_t idx = 0;\n"+valueToMeanMap+"\n"+
        offset(2)+"double sum_mean_squared[k] = {};\n"+
        offset(2)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(2)+"{\n"+offset(3)+"Cluster_mean& mean_tuple = means[cluster];\n"+
        precompMeanSum+offset(2)+"}\n"+
        offset(2)+"double distance, error = 0.0, "+
        "min_distance;\n"+
        offset(2)+"std::vector<size_t> assignments(TestDataset.size());\n"+
        // offset(2)+"#pragma omp parallel for num_threads(32) private(min_distance,distance) reduction(+:error)\n"+
        offset(2)+"for (size_t tup = 0; tup < TestDataset.size(); ++tup){\n"+
        offset(3)+"const Test_tuple &tuple = TestDataset[tup];\n"+
        // offset(2)+"for (Test_tuple& tuple : TestDataset)\n"+offset(2)+"{\n"+
        offset(3)+"min_distance = std::numeric_limits<double>::max();\n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(3)+"{\n"+
        offset(4)+"distance = "+numCategVar+"+sum_mean_squared[cluster]"+distance+";\n"+
        offset(4)+"if(distance < min_distance) assignments[tup] = cluster;\n"+
        offset(4)+"min_distance = std::min(distance, min_distance);\n"+
        offset(3)+"}\n"+offset(3)+"error += min_distance;\n"+
        offset(2)+"}\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << error;\n"+
        offset(2)+"ofs.close();\n\n"+
        offset(2)+
        "std::cout << \"Within Cluster l2-distance: \" << error << std::endl;\n"+
        offset(2)+"ofs.open(\"assignments.csv\");\n"+
        offset(2)+"for (const size_t& a : assignments)\n"+
        offset(3)+"ofs << a << \"\\n\";\n"+
        offset(2)+"ofs.close();\n"+
        offset(1)+"}\n";

    return testTuple + loadFunction + evalFunction;
}